

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O2

SpatialMatrix * __thiscall
RigidBodyDynamics::Math::SpatialTransform::toMatrixTranspose
          (SpatialMatrix *__return_storage_ptr__,SpatialTransform *this)

{
  double *pdVar1;
  undefined1 local_d0 [8];
  scalar_constant_op<double> local_c8;
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> local_c0;
  undefined4 local_90;
  undefined4 uStack_8c;
  double local_88;
  undefined8 local_80;
  Matrix3d _Erx;
  
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_outerStride =
       (Index)(this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  local_c8.m_other = (double)&local_c0;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       (PointerType)0x0;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_88 = -(double)local_c0.
                      super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>
                      .m_outerStride;
  pdVar1 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array + 1;
  local_90 = *(undefined4 *)pdVar1;
  uStack_8c = *(undefined4 *)
               ((long)(this->r).super_Vector3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 0xc);
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_xpr =
       (XprTypeNested)((ulong)*pdVar1 ^ 0x8000000000000000);
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = (ulong)(this->r).super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [2] ^ 0x8000000000000000;
  local_80 = 0;
  local_d0 = (undefined1  [8])this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&_Erx,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)local_d0);
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_d0 = (undefined1  [8])this;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       (PointerType)__return_storage_ptr__;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_xpr =
       &__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>
            (&local_c0,(Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_d0);
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x12;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_d0 = (undefined1  [8])&_Erx;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_xpr =
       &__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
            (&local_c0,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)local_d0);
  local_c8.m_other = 0.0;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 3;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 3;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_xpr =
       &__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (&local_c0,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              *)local_d0);
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>,_0>.m_data =
       (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x15;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 3;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_d0 = (undefined1  [8])this;
  local_c0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false,_true>.m_xpr =
       &__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>
            (&local_c0,(Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

SpatialMatrix toMatrixTranspose () const {
		Matrix3d _Erx =
			E * Matrix3d (
					0., -r[2], r[1],
					r[2], 0., -r[0],
					-r[1], r[0], 0.
					);
		SpatialMatrix result;
		result.block<3,3>(0,0) = E.transpose();
		result.block<3,3>(0,3) = -_Erx.transpose();
		result.block<3,3>(3,0) = Matrix3d::Zero(3,3);
		result.block<3,3>(3,3) = E.transpose();

		return result;
	}